

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int doddoremarm(void)

{
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  code *allow;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  object_pick *obj_pick_list;
  int pick_list [30];
  object_pick *local_a0;
  int local_98 [32];
  
  if (takeoff_mask != 0 || taking_off != 0) {
    pline("You continue %s.",disrobing);
    set_occupation(take_off,disrobing,0);
    return 0;
  }
  auVar8._0_4_ = -(uint)((int)uwep == 0 && (int)uquiver == 0);
  auVar8._4_4_ = -(uint)(uwep._4_4_ == 0 && uquiver._4_4_ == 0);
  auVar8._8_4_ = -(uint)((int)uarm == 0 && (int)uarmf == 0);
  auVar8._12_4_ = -(uint)(uarm._4_4_ == 0 && uarmf._4_4_ == 0);
  iVar4 = movmskps(0x31dab8,auVar8);
  if ((((iVar4 == 0xf) && (ublindf == (obj *)0x0)) && (uleft == (obj *)0x0)) &&
     ((uright == (obj *)0x0 && (bVar3 = wearing_armor(), bVar3 == '\0')))) {
    pline("You are not wearing anything.");
    return 0;
  }
  add_valid_menu_class(0);
  if (flags.menu_style == '\x03') {
    uVar5 = query_category("What type of things do you want to take off?",invent,0x18,local_98,2);
    if (uVar5 == 0) goto LAB_0018870c;
    if (0 < (int)uVar5) {
      uVar6 = 0;
      bVar2 = false;
      do {
        bVar1 = true;
        if (local_98[uVar6] != -2) {
          add_valid_menu_class(local_98[uVar6]);
          bVar1 = bVar2;
        }
        uVar6 = uVar6 + 1;
        bVar2 = bVar1;
      } while (uVar5 != uVar6);
      if (bVar1) goto LAB_0018869f;
    }
    allow = is_worn_by_type;
  }
  else {
LAB_0018869f:
    allow = is_worn;
  }
  uVar5 = query_objlist("What do you want to take off?",invent,0x1c,&local_a0,2,allow);
  if ((int)uVar5 < 1) {
    if ((int)uVar5 < 0) {
      pline("There is nothing else you can remove or unwield.");
    }
  }
  else {
    lVar7 = 0;
    do {
      select_off(*(obj **)((long)&local_a0->obj + lVar7));
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar7);
    free(local_a0);
  }
LAB_0018870c:
  if (takeoff_mask != 0) {
    disrobing = "disrobing";
    if ((takeoff_mask & 0xfffff8ffU) == 0) {
      disrobing = "disarming";
    }
    take_off();
  }
  return 0;
}

Assistant:

int doddoremarm(void)
{
    if (taking_off || takeoff_mask) {
	pline("You continue %s.", disrobing);
	set_occupation(take_off, disrobing, 0);
	return 0;
    } else if (!uwep && !uswapwep && !uquiver && !uamul && !ublindf &&
		!uleft && !uright && !wearing_armor()) {
	pline("You are not wearing anything.");
	return 0;
    }

    add_valid_menu_class(0); /* reset */
    menu_remarm(0);

    if (takeoff_mask) {
	/* default activity for armor and/or accessories,
	   possibly combined with weapons */
	disrobing = "disrobing";
	/* specific activity when handling weapons only */
	if (!(takeoff_mask & ~(W_WEP|W_SWAPWEP|W_QUIVER)))
	    disrobing = "disarming";
	take_off();
    }
    /* The time to perform the command is already completely accounted for
     * in take_off(); if we return 1, that would add an extra turn to each
     * disrobe.
     */
    return 0;
}